

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwen2vl-cli.cpp
# Opt level: O2

llava_context * llava_init_context(common_params *params,llama_model *model)

{
  char *fname;
  clip_ctx *pcVar1;
  llama_context *plVar2;
  llava_context *plVar3;
  common_log *log;
  long lVar4;
  llama_context_params *plVar5;
  undefined8 *puVar6;
  byte bVar7;
  undefined8 auStack_138 [16];
  string prompt;
  llama_context_params ctx_params;
  
  bVar7 = 0;
  fname = (params->mmproj).path._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&prompt,(string *)&params->prompt);
  if (prompt._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&prompt);
  }
  pcVar1 = clip_model_load(fname,2);
  common_context_params_to_llama(&ctx_params,params);
  ctx_params.n_ctx = 0x800;
  if (0x800 < params->n_ctx) {
    ctx_params.n_ctx = params->n_ctx;
  }
  plVar5 = &ctx_params;
  puVar6 = auStack_138;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *(undefined8 *)plVar5;
    plVar5 = (llama_context_params *)((long)plVar5 + (ulong)bVar7 * -0x10 + 8);
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  plVar2 = (llama_context *)llama_init_from_model(model);
  if (plVar2 == (llama_context *)0x0) {
    if (common_log_verbosity_thold < 0) {
      plVar3 = (llava_context *)0x0;
    }
    else {
      log = common_log_main();
      plVar3 = (llava_context *)0x0;
      common_log_add(log,GGML_LOG_LEVEL_ERROR,"%s: failed to create the llama_context\n",
                     "llava_init_context");
    }
  }
  else {
    plVar3 = (llava_context *)malloc(0x18);
    plVar3->ctx_llama = plVar2;
    plVar3->ctx_clip = pcVar1;
    plVar3->model = model;
  }
  std::__cxx11::string::~string((string *)&prompt);
  return plVar3;
}

Assistant:

static struct llava_context * llava_init_context(common_params * params, llama_model * model) {
    const char * clip_path = params->mmproj.path.c_str();

    auto prompt = params->prompt;
    if (prompt.empty()) {
        prompt = "describe the image in detail.";
    }

    auto ctx_clip = clip_model_load(clip_path, GGML_LOG_LEVEL_INFO);

    llama_context_params ctx_params = common_context_params_to_llama(*params);
    ctx_params.n_ctx           = params->n_ctx < 2048 ? 2048 : params->n_ctx; // we need a longer context size to process image embeddings

    llama_context * ctx_llama = llama_init_from_model(model, ctx_params);

    if (ctx_llama == NULL) {
        LOG_ERR("%s: failed to create the llama_context\n" , __func__);
        return NULL;
    }

    auto * ctx_llava = (struct llava_context *)malloc(sizeof(llava_context));

    ctx_llava->ctx_llama = ctx_llama;
    ctx_llava->ctx_clip = ctx_clip;
    ctx_llava->model = model;
    return ctx_llava;
}